

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O0

void __thiscall
DumpWrapperToFileCommand::wrapperAction(DumpWrapperToFileCommand *this,ExeElementWrapper *wrapper)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  string local_68;
  bufsize_t local_38;
  bufsize_t dSize;
  QString fileName;
  ExeElementWrapper *wrapper_local;
  DumpWrapperToFileCommand *this_local;
  
  if (wrapper != (ExeElementWrapper *)0x0) {
    fileName.d.size = (qsizetype)wrapper;
    iVar1 = (*(wrapper->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x11])();
    makeFileName((QString *)&dSize,this,CONCAT44(extraout_var,iVar1));
    local_38 = AbstractFileBuffer::dump
                         ((QString *)&dSize,(AbstractByteBuffer *)fileName.d.size,true);
    poVar2 = std::operator<<((ostream *)&std::cout,"Dumped size: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = std::operator<<(poVar2,"0x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
    poVar2 = std::operator<<(poVar2," into: ");
    QString::toStdString_abi_cxx11_(&local_68,(QString *)&dSize);
    poVar2 = std::operator<<(poVar2,(string *)&local_68);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_68);
    QString::~QString((QString *)&dSize);
  }
  return;
}

Assistant:

virtual void wrapperAction(ExeElementWrapper *wrapper)
    {
        if (!wrapper) {
            return;
        }
        QString fileName = makeFileName(wrapper->getOffset());
        bufsize_t dSize = FileBuffer::dump(fileName, *wrapper, true);
        std::cout << "Dumped size: " << std::hex << "0x" << dSize 
            << " into: " << fileName.toStdString()
            << std::endl;
    }